

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

void __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this,
          char_type *s,size_t length,semantic_tag tag)

{
  pointer phVar1;
  undefined1 local_11;
  
  if (length < 0xe) {
    short_string_storage::short_string_storage((short_string_storage *)this,s,(uint8_t)length,tag);
    return;
  }
  phVar1 = utility::heap_string_factory<char,_jsoncons::null_type,_std::allocator<char>_>::create
                     (s,length,&local_11);
  (this->field_0).json_ref_ = (json_reference_storage)0xf;
  (this->field_0).common_.tag_ = tag;
  (this->field_0).long_str_.ptr_ = phVar1;
  return;
}

Assistant:

basic_json(const char_type* s, std::size_t length, semantic_tag tag = semantic_tag::none)
        {
            if (length <= short_string_storage::max_length)
            {
                construct<short_string_storage>(s, static_cast<uint8_t>(length), tag);
            }
            else
            {
                auto ptr = create_long_string(allocator_type{}, s, length);
                construct<long_string_storage>(ptr, tag);
            }
        }